

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_string_utf8_index_ref(sexp ctx,sexp self,sexp_sint_t n,sexp str,sexp i)

{
  sexp psVar1;
  ulong uVar2;
  sexp_uint_t type_id;
  ulong uVar3;
  
  if ((((ulong)str & 3) == 0) && (str->tag == 9)) {
    if (((ulong)i & 1) != 0) {
      psVar1 = sexp_string_index_to_cursor(ctx,self,n,str,i);
      if ((((ulong)psVar1 & 3) == 0) && (psVar1->tag == 0x13)) {
        return psVar1;
      }
      uVar2 = (ulong)psVar1 & 0xfffffffffffffffd;
      uVar3 = uVar2 + 7;
      if (-1 < (long)uVar2) {
        uVar3 = uVar2;
      }
      if ((long)uVar3 >> 3 < (str->value).uvector.length) {
        psVar1 = sexp_string_utf8_ref(ctx,str,psVar1);
        return psVar1;
      }
      psVar1 = sexp_user_exception(ctx,self,"string-ref: index out of range",i);
      return psVar1;
    }
    type_id = 2;
  }
  else {
    type_id = 9;
    i = str;
  }
  psVar1 = sexp_type_exception(ctx,self,type_id,i);
  return psVar1;
}

Assistant:

sexp sexp_string_utf8_index_ref (sexp ctx, sexp self, sexp_sint_t n, sexp str, sexp i) {
  sexp off;
  sexp_assert_type(ctx, sexp_stringp, SEXP_STRING, str);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, i);
  off = sexp_string_index_to_cursor(ctx, self, n, str, i);
  if (sexp_exceptionp(off)) return off;
  if (sexp_unbox_string_cursor(off) >= (sexp_sint_t)sexp_string_size(str))
    return sexp_user_exception(ctx, self, "string-ref: index out of range", i);
  return sexp_string_utf8_ref(ctx, str, off);
}